

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_extended_result_codes(sqlite3 *db,int onoff)

{
  int iVar1;
  int onoff_local;
  sqlite3 *db_local;
  
  sqlite3_mutex_enter(db->mutex);
  iVar1 = 0xff;
  if (onoff != 0) {
    iVar1 = -1;
  }
  db->errMask = iVar1;
  sqlite3_mutex_leave(db->mutex);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_extended_result_codes(sqlite3 *db, int onoff){
  sqlite3_mutex_enter(db->mutex);
  db->errMask = onoff ? 0xffffffff : 0xff;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}